

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMeasurementsTest.cpp
# Opt level: O0

int TestMeasurementsTest(int argc,char **argv)

{
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  PDFPage *this;
  PDFUsedFont *pPVar3;
  unsigned_long inColorValue;
  bool bVar4;
  double local_1260;
  double local_1258;
  pair<double,_double> local_1250;
  double local_1240;
  double local_1238;
  pair<double,_double> local_1230;
  double local_1220;
  double local_1218;
  pair<double,_double> local_1210;
  double local_1200;
  double local_11f8;
  pair<double,_double> local_11f0;
  undefined1 local_11e0 [8];
  DoubleAndDoublePairList pathPoints;
  string local_11c0;
  allocator<char> local_1199;
  string local_1198;
  undefined1 local_1178 [8];
  TextMeasures textDimensions;
  TextOptions textOptions;
  string local_1118;
  undefined1 local_10f8 [8];
  GraphicOptions pathStrokeOptions;
  string local_10c8;
  string local_10a8;
  PDFUsedFont *local_1088;
  PDFUsedFont *arialFont;
  PageContentContext *cxt;
  PDFPage *local_1058;
  PDFPage *page;
  PDFCreationSettings local_1000;
  allocator<char> local_f99;
  string local_f98;
  string local_f78;
  LogConfiguration local_f58;
  allocator<char> local_f11;
  string local_f10;
  string local_ef0;
  undefined1 local_ed0 [8];
  PDFWriter pdfWriter;
  EStatusCode status;
  char **argv_local;
  int argc_local;
  
  pdfWriter.mIsModified = false;
  pdfWriter._3757_3_ = 0;
  PDFWriter::PDFWriter((PDFWriter *)local_ed0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f10,"TextMeasurementsTest.pdf",&local_f11);
  BuildRelativeOutputPath(&local_ef0,argv,&local_f10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f98,"TextMeasurementsTest.log",&local_f99);
  BuildRelativeOutputPath(&local_f78,argv,&local_f98);
  LogConfiguration::LogConfiguration(&local_f58,true,true,&local_f78);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)&page,pEVar2);
  PDFCreationSettings::PDFCreationSettings(&local_1000,true,true,(EncryptionOptions *)&page,false);
  pdfWriter._3756_4_ =
       PDFWriter::StartPDF((PDFWriter *)local_ed0,&local_ef0,ePDFVersion13,&local_f58,&local_1000);
  PDFCreationSettings::~PDFCreationSettings(&local_1000);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&page);
  LogConfiguration::~LogConfiguration(&local_f58);
  std::__cxx11::string::~string((string *)&local_f78);
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator(&local_f99);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_f10);
  std::allocator<char>::~allocator(&local_f11);
  if (pdfWriter._3756_4_ == 0) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    local_1058 = this;
    PDFRectangle::PDFRectangle((PDFRectangle *)&cxt,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)&cxt);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&cxt);
    arialFont = (PDFUsedFont *)PDFWriter::StartPageContentContext((PDFWriter *)local_ed0,local_1058)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10c8,"fonts/arial.ttf",
               (allocator<char> *)((long)&pathStrokeOptions.opacity + 7));
    BuildRelativeInputPath(&local_10a8,argv,&local_10c8);
    pPVar3 = PDFWriter::GetFontForFile((PDFWriter *)local_ed0,&local_10a8,0);
    std::__cxx11::string::~string((string *)&local_10a8);
    std::__cxx11::string::~string((string *)&local_10c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pathStrokeOptions.opacity + 7));
    local_1088 = pPVar3;
    if (pPVar3 == (PDFUsedFont *)0x0) {
      pdfWriter.mIsModified = true;
      pdfWriter._3757_3_ = 0xffffff;
      std::operator<<((ostream *)&std::cout,"Failed to create font for arial font\n");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1118,"DarkMagenta",
                 (allocator<char> *)((long)&textOptions.opacity + 7));
      inColorValue = AbstractContentContext::ColorValueForName(&local_1118);
      AbstractContentContext::GraphicOptions::GraphicOptions
                ((GraphicOptions *)local_10f8,eStroke,eRGB,inColorValue,4.0,false,255.0);
      std::__cxx11::string::~string((string *)&local_1118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&textOptions.opacity + 7));
      AbstractContentContext::TextOptions::TextOptions
                ((TextOptions *)&textDimensions.height,local_1088,14.0,eGray,0,255.0);
      pPVar3 = local_1088;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1198,"Hello World",&local_1199);
      PDFUsedFont::CalculateTextDimensions((TextMeasures *)local_1178,pPVar3,&local_1198,0xe);
      std::__cxx11::string::~string((string *)&local_1198);
      std::allocator<char>::~allocator(&local_1199);
      pPVar3 = arialFont;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11c0,"Hello World",
                 (allocator<char> *)
                 ((long)&pathPoints.
                         super__List_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl._M_node._M_size + 7));
      AbstractContentContext::WriteText
                ((AbstractContentContext *)pPVar3,10.0,100.0,&local_11c0,
                 (TextOptions *)&textDimensions.height);
      std::__cxx11::string::~string((string *)&local_11c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&pathPoints.
                         super__List_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl._M_node._M_size + 7));
      std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      list((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
           local_11e0);
      local_11f8 = (double)local_1178 + 10.0;
      local_1200 = textDimensions.xMin + 98.0;
      std::pair<double,_double>::pair<double,_double,_true>(&local_11f0,&local_11f8,&local_1200);
      std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      push_back((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                local_11e0,&local_11f0);
      local_1218 = textDimensions.yMin + 10.0;
      local_1220 = textDimensions.xMin + 98.0;
      std::pair<double,_double>::pair<double,_double,_true>(&local_1210,&local_1218,&local_1220);
      std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      push_back((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                local_11e0,&local_1210);
      AbstractContentContext::DrawPath
                ((AbstractContentContext *)arialFont,(DoubleAndDoublePairList *)local_11e0,
                 (GraphicOptions *)local_10f8);
      std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      clear((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
            local_11e0);
      local_1238 = (double)local_1178 + 10.0;
      local_1240 = textDimensions.xMax + 102.0;
      std::pair<double,_double>::pair<double,_double,_true>(&local_1230,&local_1238,&local_1240);
      std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      push_back((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                local_11e0,&local_1230);
      local_1258 = textDimensions.yMin + 10.0;
      local_1260 = textDimensions.xMax + 102.0;
      std::pair<double,_double>::pair<double,_double,_true>(&local_1250,&local_1258,&local_1260);
      std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      push_back((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                local_11e0,&local_1250);
      AbstractContentContext::DrawPath
                ((AbstractContentContext *)arialFont,(DoubleAndDoublePairList *)local_11e0,
                 (GraphicOptions *)local_10f8);
      pdfWriter._3756_4_ =
           PDFWriter::EndPageContentContext((PDFWriter *)local_ed0,(PageContentContext *)arialFont);
      if (pdfWriter._3756_4_ == eSuccess) {
        pdfWriter._3756_4_ = PDFWriter::WritePageAndRelease((PDFWriter *)local_ed0,local_1058);
        if (pdfWriter._3756_4_ == eSuccess) {
          EVar1 = PDFWriter::EndPDF((PDFWriter *)local_ed0);
          if (EVar1 == eSuccess) {
            pdfWriter.mIsModified = false;
            pdfWriter._3757_3_ = 0;
          }
          else {
            pdfWriter.mIsModified = true;
            pdfWriter._3757_3_ = 0xffffff;
            std::operator<<((ostream *)&std::cout,"Failed to end pdf\n");
          }
        }
        else {
          pdfWriter.mIsModified = true;
          pdfWriter._3757_3_ = 0xffffff;
          std::operator<<((ostream *)&std::cout,"Failed to write page\n");
        }
      }
      else {
        pdfWriter.mIsModified = true;
        pdfWriter._3757_3_ = 0xffffff;
        std::operator<<((ostream *)&std::cout,"Failed to end content context\n");
      }
      std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      ~list((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
            local_11e0);
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"Failed to start file\n");
  }
  bVar4 = pdfWriter._3756_4_ != 0;
  PDFWriter::~PDFWriter((PDFWriter *)local_ed0);
  return (uint)bVar4;
}

Assistant:

int TestMeasurementsTest(int argc, char* argv[])
{
	EStatusCode status = eSuccess;
	PDFWriter pdfWriter;

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"TextMeasurementsTest.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,
                                                     BuildRelativeOutputPath(argv,"TextMeasurementsTest.log")));
		if(status != eSuccess)
		{
			cout<<"Failed to start file\n";
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
		
		PageContentContext* cxt = pdfWriter.StartPageContentContext(page);
		PDFUsedFont* arialFont = pdfWriter.GetFontForFile(
                                                     BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/arial.ttf"));
		if(!arialFont)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font for arial font\n";
			break;
		}

		AbstractContentContext::GraphicOptions pathStrokeOptions(AbstractContentContext::eStroke,
																AbstractContentContext::eRGB,
																AbstractContentContext::ColorValueForName("DarkMagenta"),
																4);
		AbstractContentContext::TextOptions textOptions(arialFont,
														14,
														AbstractContentContext::eGray,
														0);

		PDFUsedFont::TextMeasures textDimensions = arialFont->CalculateTextDimensions("Hello World",14);

		cxt->WriteText(10,100,"Hello World",textOptions);
		DoubleAndDoublePairList pathPoints;
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,98+textDimensions.yMin));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,98+textDimensions.yMin));
		cxt->DrawPath(pathPoints,pathStrokeOptions);
		pathPoints.clear();
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,102+textDimensions.yMax));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,102+textDimensions.yMax));
		cxt->DrawPath(pathPoints,pathStrokeOptions);

		status = pdfWriter.EndPageContentContext(cxt);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to write page\n";
			break;
		}


		status = pdfWriter.EndPDF();
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end pdf\n";
			break;
		}

	}while(false);


	return status == eSuccess ? 0:1;
}